

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

void soundfile_finishwrite
               (void *obj,char *filename,t_soundfile *sf,size_t nframes,size_t frameswritten)

{
  int iVar1;
  int *piVar2;
  
  if (frameswritten < nframes) {
    if (nframes != 0xffffffffffffffff) {
      pd_error(obj,"soundfiler write: %ld out of %ld frames written",frameswritten);
    }
    iVar1 = (*sf->sf_type->t_updateheaderfn)(sf,frameswritten);
    if (iVar1 == 0) {
      piVar2 = __errno_location();
      object_sferror(obj,"soundfiler write",filename,*piVar2,sf);
      return;
    }
  }
  return;
}

Assistant:

static void soundfile_finishwrite(void *obj, const char *filename,
    t_soundfile *sf, size_t nframes, size_t frameswritten)
{
    if (frameswritten >= nframes) return;
    if (nframes < SFMAXFRAMES)
        pd_error(obj, "soundfiler write: %ld out of %ld frames written",
            (long)frameswritten, (long)nframes);
    if (sf->sf_type->t_updateheaderfn(sf, frameswritten))
        return;
    object_sferror(obj, "soundfiler write", filename, errno, sf);
}